

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3InitTokenizer(Fts3Hash *pHash,char *zArg,sqlite3_tokenizer **ppTok,char **pzErr)

{
  long lVar1;
  char *pcVar2;
  Fts3Hash *pFVar3;
  size_t sVar4;
  void *pvVar5;
  char **in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int nKey;
  long in_FS_OFFSET;
  char **aNew;
  sqlite3_int64 nNew;
  int iArg;
  char **aArg;
  sqlite3_tokenizer_module *m;
  char *zEnd;
  char *zCopy;
  char *z;
  int rc;
  int n;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  Fts3Hash *pH;
  char *in_stack_ffffffffffffff88;
  int local_64;
  char *local_60;
  Fts3Hash *local_40;
  int local_34;
  int local_10;
  
  nKey = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar3 = (Fts3Hash *)sqlite3_mprintf("%s",in_RSI);
  if (pFVar3 == (Fts3Hash *)0x0) {
    local_10 = 7;
  }
  else {
    pH = pFVar3;
    sVar4 = strlen((char *)pFVar3);
    pcVar2 = &pH->keyClass;
    local_40 = (Fts3Hash *)sqlite3Fts3NextToken(in_stack_ffffffffffffff88,(int *)pH);
    if (local_40 == (Fts3Hash *)0x0) {
      local_40 = pFVar3;
    }
    local_40->keyClass = '\0';
    sqlite3Fts3Dequote(&local_40->keyClass);
    pFVar3 = local_40;
    strlen(&local_40->keyClass);
    pvVar5 = sqlite3Fts3HashFind(pH,pFVar3,nKey);
    if (pvVar5 == (void *)0x0) {
      sqlite3Fts3ErrMsg(in_RCX,"unknown tokenizer: %s",local_40);
      local_34 = 1;
LAB_0024953f:
      sqlite3_free((void *)0x249549);
      local_10 = local_34;
    }
    else {
      local_60 = (char *)0x0;
      local_64 = 0;
      while( true ) {
        local_40 = (Fts3Hash *)&local_40->copyKey;
        in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c & 0xffffff;
        if (local_40 < pcVar2 + sVar4) {
          local_40 = (Fts3Hash *)sqlite3Fts3NextToken(in_stack_ffffffffffffff88,(int *)pH);
          in_stack_ffffffffffffff6c =
               CONCAT13(local_40 != (Fts3Hash *)0x0,(int3)in_stack_ffffffffffffff6c);
        }
        if ((char)(in_stack_ffffffffffffff6c >> 0x18) == '\0') {
          local_34 = (**(code **)((long)pvVar5 + 8))(local_64,local_60,in_RDX);
          if (local_34 == 0) {
            *(void **)*in_RDX = pvVar5;
          }
          else {
            sqlite3Fts3ErrMsg(in_RCX,"unknown tokenizer");
          }
          sqlite3_free((void *)0x24953f);
          goto LAB_0024953f;
        }
        local_60 = (char *)sqlite3_realloc64((void *)CONCAT44(in_stack_ffffffffffffff6c,
                                                              in_stack_ffffffffffffff68),0x249459);
        if (local_60 == (char *)0x0) break;
        *(Fts3Hash **)(local_60 + (long)local_64 * 8) = local_40;
        local_40->keyClass = '\0';
        in_stack_ffffffffffffff88 = local_60;
        sqlite3Fts3Dequote(&local_40->keyClass);
        local_64 = local_64 + 1;
      }
      sqlite3_free((void *)0x249470);
      sqlite3_free((void *)0x24947a);
      local_10 = 7;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3InitTokenizer(
  Fts3Hash *pHash,                /* Tokenizer hash table */
  const char *zArg,               /* Tokenizer name */
  sqlite3_tokenizer **ppTok,      /* OUT: Tokenizer (if applicable) */
  char **pzErr                    /* OUT: Set to malloced error message */
){
  int rc;
  char *z = (char *)zArg;
  int n = 0;
  char *zCopy;
  char *zEnd;                     /* Pointer to nul-term of zCopy */
  sqlite3_tokenizer_module *m;

  zCopy = sqlite3_mprintf("%s", zArg);
  if( !zCopy ) return SQLITE_NOMEM;
  zEnd = &zCopy[strlen(zCopy)];

  z = (char *)sqlite3Fts3NextToken(zCopy, &n);
  if( z==0 ){
    assert( n==0 );
    z = zCopy;
  }
  z[n] = '\0';
  sqlite3Fts3Dequote(z);

  m = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,z,(int)strlen(z)+1);
  if( !m ){
    sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer: %s", z);
    rc = SQLITE_ERROR;
  }else{
    char const **aArg = 0;
    int iArg = 0;
    z = &z[n+1];
    while( z<zEnd && (NULL!=(z = (char *)sqlite3Fts3NextToken(z, &n))) ){
      sqlite3_int64 nNew = sizeof(char *)*(iArg+1);
      char const **aNew = (const char **)sqlite3_realloc64((void *)aArg, nNew);
      if( !aNew ){
        sqlite3_free(zCopy);
        sqlite3_free((void *)aArg);
        return SQLITE_NOMEM;
      }
      aArg = aNew;
      aArg[iArg++] = z;
      z[n] = '\0';
      sqlite3Fts3Dequote(z);
      z = &z[n+1];
    }
    rc = m->xCreate(iArg, aArg, ppTok);
    assert( rc!=SQLITE_OK || *ppTok );
    if( rc!=SQLITE_OK ){
      sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer");
    }else{
      (*ppTok)->pModule = m;
    }
    sqlite3_free((void *)aArg);
  }

  sqlite3_free(zCopy);
  return rc;
}